

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

CK_RV __thiscall
Token::createToken(Token *this,ObjectStore *objectStore,ByteString *soPIN,CK_UTF8CHAR_PTR label)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  size_t sVar4;
  ObjectStoreToken *pOVar5;
  SecureDataManager *this_00;
  char *format;
  CK_RV CStack_170;
  CK_ULONG flags;
  ByteString userPINBlob;
  MutexLocker lock;
  ByteString labelByteStr;
  ByteString soPINBlob;
  
  MutexLocker::MutexLocker(&lock,this->tokenMutex);
  if (objectStore == (ObjectStore *)0x0) {
    CStack_170 = 5;
    goto LAB_0016b8d9;
  }
  if (label == (CK_UTF8CHAR_PTR)0x0) {
    CStack_170 = 7;
    goto LAB_0016b8d9;
  }
  ByteString::ByteString(&labelByteStr,label,0x20);
  pOVar5 = this->token;
  if (pOVar5 == (ObjectStoreToken *)0x0) {
    SecureDataManager::SecureDataManager((SecureDataManager *)&soPINBlob);
    bVar1 = SecureDataManager::setSOPIN((SecureDataManager *)&soPINBlob,soPIN);
    if (bVar1) {
      pOVar5 = ObjectStore::newToken(objectStore,&labelByteStr);
      if (pOVar5 == (ObjectStoreToken *)0x0) {
        format = "Could not create the token";
        iVar3 = 0x1af;
      }
      else {
        SecureDataManager::getSOPINBlob(&userPINBlob,(SecureDataManager *)&soPINBlob);
        iVar3 = (**pOVar5->_vptr_ObjectStoreToken)(pOVar5,&userPINBlob);
        ByteString::~ByteString(&userPINBlob);
        if ((char)iVar3 != '\0') {
          this->token = pOVar5;
          CStack_170 = 0x30;
          bVar1 = true;
          goto LAB_0016b836;
        }
        softHSMLog(3,"createToken",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                   ,0x1b6,"Failed to set SO PIN on new token");
        bVar1 = ObjectStore::destroyToken(objectStore,pOVar5);
        if (bVar1) {
          CStack_170 = 0x30;
          goto LAB_0016b74f;
        }
        format = "Failed to destroy incomplete token";
        iVar3 = 0x1ba;
      }
      bVar1 = false;
      softHSMLog(3,"createToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                 ,iVar3,format);
      CStack_170 = 0x30;
    }
    else {
      CStack_170 = 5;
LAB_0016b74f:
      bVar1 = false;
    }
LAB_0016b836:
    SecureDataManager::~SecureDataManager((SecureDataManager *)&soPINBlob);
    if (bVar1) {
LAB_0016b849:
      ByteString::ByteString(&soPINBlob);
      ByteString::ByteString(&userPINBlob);
      iVar3 = (*this->token->_vptr_ObjectStoreToken[1])(this->token,&soPINBlob);
      if ((char)iVar3 == '\0') {
        uVar2 = false;
      }
      else {
        iVar3 = (*this->token->_vptr_ObjectStoreToken[3])(this->token,&userPINBlob);
        uVar2 = (undefined1)iVar3;
      }
      this->valid = (bool)uVar2;
      if (this->sdm != (SecureDataManager *)0x0) {
        (*this->sdm->_vptr_SecureDataManager[1])();
      }
      this_00 = (SecureDataManager *)operator_new(0xd0);
      SecureDataManager::SecureDataManager(this_00,&soPINBlob,&userPINBlob);
      this->sdm = this_00;
      ByteString::~ByteString(&userPINBlob);
      ByteString::~ByteString(&soPINBlob);
      CStack_170 = 0;
    }
  }
  else {
    iVar3 = (*pOVar5->_vptr_ObjectStoreToken[4])(pOVar5,&flags);
    if ((char)iVar3 == '\0') {
      softHSMLog(3,"createToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                 ,0x189,"Could not get the token flags");
      CStack_170 = 5;
    }
    else {
      SecureDataManager::getSOPINBlob(&soPINBlob,this->sdm);
      sVar4 = ByteString::size(&soPINBlob);
      if (sVar4 == 0) {
        ByteString::~ByteString(&soPINBlob);
      }
      else {
        bVar1 = SecureDataManager::loginSO(this->sdm,soPIN);
        ByteString::~ByteString(&soPINBlob);
        if (!bVar1) {
          flags = flags | 0x100000;
          (*this->token->_vptr_ObjectStoreToken[5])();
          CStack_170 = 0xa0;
          softHSMLog(3,"createToken",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                     ,0x193,"Incorrect SO PIN");
          goto LAB_0016b8cf;
        }
      }
      flags = flags & 0xffffffffffefffff;
      (*this->token->_vptr_ObjectStoreToken[5])();
      iVar3 = (*this->token->_vptr_ObjectStoreToken[0x11])(this->token,&labelByteStr);
      if ((char)iVar3 != '\0') goto LAB_0016b849;
      softHSMLog(3,"createToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                 ,0x19c,"Could not reset the token");
      CStack_170 = 0x30;
    }
  }
LAB_0016b8cf:
  ByteString::~ByteString(&labelByteStr);
LAB_0016b8d9:
  MutexLocker::~MutexLocker(&lock);
  return CStack_170;
}

Assistant:

CK_RV Token::createToken(ObjectStore* objectStore, ByteString& soPIN, CK_UTF8CHAR_PTR label)
{
	CK_ULONG flags;

	// Lock access to the token
	MutexLocker lock(tokenMutex);

	if (objectStore == NULL) return CKR_GENERAL_ERROR;
	if (label == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Convert the label
	ByteString labelByteStr((const unsigned char*) label, 32);

	if (token != NULL)
	{
		// Get token flags
		if (!token->getTokenFlags(flags))
		{
			ERROR_MSG("Could not get the token flags");
			return CKR_GENERAL_ERROR;
		}

		// Verify SO PIN
		if (sdm->getSOPINBlob().size() > 0 && !sdm->loginSO(soPIN))
		{
			flags |= CKF_SO_PIN_COUNT_LOW;
			token->setTokenFlags(flags);

			ERROR_MSG("Incorrect SO PIN");
			return CKR_PIN_INCORRECT;
		}
		flags &= ~CKF_SO_PIN_COUNT_LOW;
		token->setTokenFlags(flags);

		// Reset the token
		if (!token->resetToken(labelByteStr))
		{
			ERROR_MSG("Could not reset the token");
			return CKR_DEVICE_ERROR;
		}
	}
	else
	{
		// Generate the SO PIN blob
		SecureDataManager soPINBlobGen;

		if (!soPINBlobGen.setSOPIN(soPIN))
		{
			return CKR_GENERAL_ERROR;
		}

		// Create the token
		ObjectStoreToken* newToken = objectStore->newToken(labelByteStr);

		if (newToken == NULL)
		{
			ERROR_MSG("Could not create the token");
			return CKR_DEVICE_ERROR;
		}

		// Set the SO PIN on the token
		if (!newToken->setSOPIN(soPINBlobGen.getSOPINBlob()))
		{
			ERROR_MSG("Failed to set SO PIN on new token");

			if (!objectStore->destroyToken(newToken))
			{
				ERROR_MSG("Failed to destroy incomplete token");
			}

			return CKR_DEVICE_ERROR;
		}

		token = newToken;
	}

	ByteString soPINBlob, userPINBlob;

	valid = token->getSOPIN(soPINBlob) && token->getUserPIN(userPINBlob);

	if (sdm != NULL) delete sdm;
	sdm = new SecureDataManager(soPINBlob, userPINBlob);

	return CKR_OK;
}